

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sphere.h
# Opt level: O3

BBox * __thiscall CMU462::StaticScene::Sphere::get_bbox(Sphere *this)

{
  double dVar1;
  BBox *in_RDI;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  
  dVar1 = this->r;
  dVar2 = (this->o).z;
  dVar3 = dVar1 + dVar2;
  dVar2 = dVar2 - dVar1;
  dVar4 = (this->o).x;
  dVar5 = (this->o).y;
  dVar6 = dVar1 + dVar4;
  dVar7 = dVar1 + dVar5;
  (in_RDI->max).x = dVar6;
  (in_RDI->max).y = dVar7;
  (in_RDI->max).z = dVar3;
  dVar4 = dVar4 - dVar1;
  dVar5 = dVar5 - dVar1;
  (in_RDI->min).x = dVar4;
  (in_RDI->min).y = dVar5;
  (in_RDI->min).z = dVar2;
  (in_RDI->extent).x = dVar6 - dVar4;
  (in_RDI->extent).y = dVar7 - dVar5;
  (in_RDI->extent).z = dVar3 - dVar2;
  return in_RDI;
}

Assistant:

BBox get_bbox() const {
    return BBox(o - Vector3D(r, r, r), o + Vector3D(r, r, r));
  }